

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O3

Status * __thiscall
draco::PlyDecoder::DecodeVertexData
          (Status *__return_storage_ptr__,PlyDecoder *this,PlyElement *vertex_element)

{
  int64_t *piVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  pointer *pppPVar3;
  DataType dt;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var4;
  size_t sVar5;
  undefined1 uVar6;
  int32_t iVar7;
  int iVar8;
  const_iterator cVar9;
  DataBuffer *pDVar10;
  undefined8 uVar11;
  pointer *__ptr;
  PlyProperty *pPVar12;
  PlyProperty *pPVar13;
  ulong uVar14;
  ulong uVar15;
  PlyProperty *property;
  ValueType VVar16;
  int iVar17;
  pointer pPVar18;
  uint uVar19;
  long lVar20;
  GeometryAttribute va;
  PlyProperty *local_108;
  int local_f4;
  ulong local_f0;
  vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_> properties;
  _Manager_type local_d0;
  _Invoker_type local_c8;
  PlyProperty *y_prop;
  uint local_ac;
  ulong local_a8;
  PlyProperty *z_prop;
  PlyProperty *x_prop;
  array<float,_3UL> val;
  PlyPropertyReader<float> z_reader;
  PlyPropertyReader<float> y_reader;
  
  piVar1 = &va.buffer_descriptor_.buffer_update_count;
  va.buffer_ = (DataBuffer *)piVar1;
  if (vertex_element == (PlyElement *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&va,"vertex_element is null","");
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
               (long)&((va.buffer_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + va.buffer_descriptor_.buffer_id);
    if (va.buffer_ == (DataBuffer *)piVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_0011934d;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"x","");
  this_00 = &vertex_element->property_index_;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&this_00->_M_t,(key_type *)&va);
  p_Var2 = &(vertex_element->property_index_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
    pPVar18 = (pointer)0x0;
  }
  else {
    pPVar18 = (vertex_element->properties_).
              super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
              super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
  }
  if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
    operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
  }
  va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
  x_prop = pPVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"y","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&this_00->_M_t,(key_type *)&va);
  if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
    pPVar18 = (pointer)0x0;
  }
  else {
    pPVar18 = (vertex_element->properties_).
              super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
              super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
  }
  if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
    operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
  }
  va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
  y_prop = pPVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&va,"z","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&this_00->_M_t,(key_type *)&va);
  if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
    pPVar18 = (pointer)0x0;
  }
  else {
    pPVar18 = (vertex_element->properties_).
              super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>._M_impl.
              super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
  }
  if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
    operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
  }
  z_prop = pPVar18;
  if (((pPVar18 == (pointer)0x0) || (x_prop == (PlyProperty *)0x0)) ||
     (y_prop == (PlyProperty *)0x0)) {
    va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&va,"x, y, or z property is missing","");
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
               (long)&((va.buffer_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + va.buffer_descriptor_.buffer_id);
  }
  else {
    local_f0 = vertex_element->num_entries_;
    this->out_point_cloud_->num_points_ = (ValueType)local_f0;
    dt = x_prop->data_type_;
    if ((dt == y_prop->data_type_) && (dt == pPVar18->data_type_)) {
      if ((dt == DT_INT32) || (dt == DT_FLOAT32)) {
        GeometryAttribute::GeometryAttribute(&va);
        iVar7 = DataTypeLength(dt);
        GeometryAttribute::Init(&va,POSITION,(DataBuffer *)0x0,'\x03',dt,false,(long)(iVar7 * 3),0);
        iVar8 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,(ValueType)local_f0);
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>>::
        _M_realloc_insert<draco::PlyProperty_const*const&>
                  ((vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>> *)
                   &properties,(iterator)0x0,&x_prop);
        if (properties.
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            properties.
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>>::
          _M_realloc_insert<draco::PlyProperty_const*const&>
                    ((vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>> *)
                     &properties,
                     (iterator)
                     properties.
                     super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&y_prop);
        }
        else {
          *properties.
           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = y_prop;
          properties.
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               properties.
               super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (properties.
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            properties.
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>>::
          _M_realloc_insert<draco::PlyProperty_const*const&>
                    ((vector<draco::PlyProperty_const*,std::allocator<draco::PlyProperty_const*>> *)
                     &properties,
                     (iterator)
                     properties.
                     super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&z_prop);
        }
        else {
          *properties.
           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = z_prop;
          properties.
          super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               properties.
               super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (dt == DT_INT32) {
          ReadPropertiesToAttribute<int>
                    (this,&properties,
                     (PointAttribute *)
                     (this->out_point_cloud_->attributes_).
                     super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_t.
                     super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     ._M_t,(int)local_f0);
        }
        else if (dt == DT_FLOAT32) {
          ReadPropertiesToAttribute<float>
                    (this,&properties,
                     (PointAttribute *)
                     (this->out_point_cloud_->attributes_).
                     super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_t.
                     super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     ._M_t,(int)local_f0);
        }
        if (properties.
            super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          uVar14 = (long)properties.
                         super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)properties.
                         super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pDVar10 = (DataBuffer *)
                    properties.
                    super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00119476;
        }
      }
      else {
        va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&va,"x, y, and z properties must be of type float32 or int32","");
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                   (long)&((va.buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + va.buffer_descriptor_.buffer_id);
        if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
          uVar14 = va.buffer_descriptor_.buffer_update_count + 1;
          pDVar10 = va.buffer_;
LAB_00119476:
          operator_delete(pDVar10,uVar14);
        }
      }
      if ((dt != DT_FLOAT32) && (dt != DT_INT32)) {
        return __return_storage_ptr__;
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"nx","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        local_108 = (PlyProperty *)0x0;
      }
      else {
        local_108 = (vertex_element->properties_).
                    super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                    _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"ny","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        pPVar12 = (PlyProperty *)0x0;
      }
      else {
        pPVar12 = (vertex_element->properties_).
                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"nz","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        pPVar13 = (PlyProperty *)0x0;
      }
      else {
        pPVar13 = (vertex_element->properties_).
                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      local_a8 = local_f0 & 0xffffffff;
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      if (((((local_108 != (PlyProperty *)0x0) && (pPVar12 != (PlyProperty *)0x0)) &&
           (pPVar13 != (PlyProperty *)0x0)) &&
          ((local_108->data_type_ == DT_FLOAT32 && (pPVar12->data_type_ == DT_FLOAT32)))) &&
         (pPVar13->data_type_ == DT_FLOAT32)) {
        PlyPropertyReader<float>::PlyPropertyReader
                  ((PlyPropertyReader<float> *)&properties,local_108);
        PlyPropertyReader<float>::PlyPropertyReader(&y_reader,pPVar12);
        PlyPropertyReader<float>::PlyPropertyReader(&z_reader,pPVar13);
        GeometryAttribute::GeometryAttribute(&va);
        GeometryAttribute::Init(&va,NORMAL,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
        VVar16 = (ValueType)local_f0;
        iVar8 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,VVar16);
        if (VVar16 != 0) {
          uVar14 = 0;
          do {
            iVar17 = (int)uVar14;
            local_f4 = iVar17;
            if (((local_d0 == (_Manager_type)0x0) ||
                (val._M_elems[0] =
                      (*local_c8)((_Any_data *)
                                  &properties.
                                   super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_f4),
                local_f4 = iVar17,
                y_reader.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0))
               || (val._M_elems[1] =
                        (*y_reader.convert_value_func_._M_invoker)
                                  ((_Any_data *)&y_reader.convert_value_func_,&local_f4),
                  local_f4 = iVar17,
                  z_reader.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0
                  )) {
LAB_00119d00:
              uVar11 = std::__throw_bad_function_call();
              __clang_call_terminate(uVar11);
            }
            val._M_elems[2] =
                 (*z_reader.convert_value_func_._M_invoker)
                           ((_Any_data *)&z_reader.convert_value_func_,&local_f4);
            _Var4._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
                 (this->out_point_cloud_->attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
            sVar5 = *(size_t *)
                     ((long)_Var4._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     0x28);
            memcpy((void *)(sVar5 * uVar14 +
                           **(long **)_Var4._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl),&val,sVar5);
            uVar14 = uVar14 + 1;
          } while (local_a8 != uVar14);
        }
        if (z_reader.convert_value_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*z_reader.convert_value_func_.super__Function_base._M_manager)
                    ((_Any_data *)&z_reader.convert_value_func_,
                     (_Any_data *)&z_reader.convert_value_func_,__destroy_functor);
        }
        if (y_reader.convert_value_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*y_reader.convert_value_func_.super__Function_base._M_manager)
                    ((_Any_data *)&y_reader.convert_value_func_,
                     (_Any_data *)&y_reader.convert_value_func_,__destroy_functor);
        }
        if (local_d0 != (_Manager_type)0x0) {
          pppPVar3 = &properties.
                      super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          (*local_d0)((_Any_data *)pppPVar3,(_Any_data *)pppPVar3,__destroy_functor);
        }
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"red","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        pPVar12 = (PlyProperty *)0x0;
      }
      else {
        pPVar12 = (vertex_element->properties_).
                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"green","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        pPVar13 = (PlyProperty *)0x0;
      }
      else {
        pPVar13 = (vertex_element->properties_).
                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"blue","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        local_108 = (PlyProperty *)0x0;
      }
      else {
        local_108 = (vertex_element->properties_).
                    super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                    _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
      std::__cxx11::string::_M_construct<char_const*>((string *)&va,"alpha","");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&this_00->_M_t,(key_type *)&va);
      if ((_Rb_tree_header *)cVar9._M_node == p_Var2) {
        property = (PlyProperty *)0x0;
      }
      else {
        property = (vertex_element->properties_).
                   super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                   _M_impl.super__Vector_impl_data._M_start + (int)cVar9._M_node[2]._M_color;
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      local_ac = (pPVar12 != (PlyProperty *)0x0) + 1;
      if (pPVar13 == (PlyProperty *)0x0) {
        local_ac = (uint)(pPVar12 != (PlyProperty *)0x0);
      }
      uVar19 = (uint)(property != (PlyProperty *)0x0) +
               ((local_ac + 1) - (uint)(local_108 == (PlyProperty *)0x0));
      if (uVar19 != 0) {
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        properties.
        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pPVar12 != (PlyProperty *)0x0) {
          if (pPVar12->data_type_ != DT_UINT8) {
            va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&va,"Type of \'red\' property must be uint8","");
            __return_storage_ptr__->code_ = INVALID_PARAMETER;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                       (long)&((va.buffer_)->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       va.buffer_descriptor_.buffer_id);
            goto LAB_00119cd1;
          }
          pDVar10 = (DataBuffer *)operator_new(0x28);
          PlyPropertyReader<unsigned_char>::PlyPropertyReader
                    ((PlyPropertyReader<unsigned_char> *)pDVar10,pPVar12);
          va.buffer_ = pDVar10;
          std::
          vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
          ::
          emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                    ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                      *)&properties,
                     (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                      *)&va);
          if (va.buffer_ != (DataBuffer *)0x0) {
            std::default_delete<draco::PlyPropertyReader<unsigned_char>_>::operator()
                      ((default_delete<draco::PlyPropertyReader<unsigned_char>_> *)&va,
                       (PlyPropertyReader<unsigned_char> *)va.buffer_);
          }
        }
        if (pPVar13 != (PlyProperty *)0x0) {
          if (pPVar13->data_type_ != DT_UINT8) {
            va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&va,"Type of \'green\' property must be uint8","");
            __return_storage_ptr__->code_ = INVALID_PARAMETER;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                       (long)&((va.buffer_)->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       va.buffer_descriptor_.buffer_id);
            goto LAB_00119cd1;
          }
          pDVar10 = (DataBuffer *)operator_new(0x28);
          PlyPropertyReader<unsigned_char>::PlyPropertyReader
                    ((PlyPropertyReader<unsigned_char> *)pDVar10,pPVar13);
          va.buffer_ = pDVar10;
          std::
          vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
          ::
          emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                    ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                      *)&properties,
                     (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                      *)&va);
          if (va.buffer_ != (DataBuffer *)0x0) {
            std::default_delete<draco::PlyPropertyReader<unsigned_char>_>::operator()
                      ((default_delete<draco::PlyPropertyReader<unsigned_char>_> *)&va,
                       (PlyPropertyReader<unsigned_char> *)va.buffer_);
          }
        }
        if (local_108 != (PlyProperty *)0x0) {
          if (local_108->data_type_ != DT_UINT8) {
            va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&va,"Type of \'blue\' property must be uint8","");
            __return_storage_ptr__->code_ = INVALID_PARAMETER;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                       (long)&((va.buffer_)->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       va.buffer_descriptor_.buffer_id);
            goto LAB_00119cd1;
          }
          pDVar10 = (DataBuffer *)operator_new(0x28);
          PlyPropertyReader<unsigned_char>::PlyPropertyReader
                    ((PlyPropertyReader<unsigned_char> *)pDVar10,local_108);
          va.buffer_ = pDVar10;
          std::
          vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
          ::
          emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                    ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                      *)&properties,
                     (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                      *)&va);
          if (va.buffer_ != (DataBuffer *)0x0) {
            std::default_delete<draco::PlyPropertyReader<unsigned_char>_>::operator()
                      ((default_delete<draco::PlyPropertyReader<unsigned_char>_> *)&va,
                       (PlyPropertyReader<unsigned_char> *)va.buffer_);
          }
        }
        if (property != (PlyProperty *)0x0) {
          if (property->data_type_ != DT_UINT8) {
            va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&va,"Type of \'alpha\' property must be uint8","");
            __return_storage_ptr__->code_ = INVALID_PARAMETER;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->error_msg_).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                       (long)&((va.buffer_)->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       va.buffer_descriptor_.buffer_id);
LAB_00119cd1:
            if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
              operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
            }
            std::
            vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
            ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                       *)&properties);
            return __return_storage_ptr__;
          }
          pDVar10 = (DataBuffer *)operator_new(0x28);
          PlyPropertyReader<unsigned_char>::PlyPropertyReader
                    ((PlyPropertyReader<unsigned_char> *)pDVar10,property);
          va.buffer_ = pDVar10;
          std::
          vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
          ::
          emplace_back<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>
                    ((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,std::default_delete<draco::PlyPropertyReader<unsigned_char>>>>>
                      *)&properties,
                     (unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>
                      *)&va);
          if (va.buffer_ != (DataBuffer *)0x0) {
            std::default_delete<draco::PlyPropertyReader<unsigned_char>_>::operator()
                      ((default_delete<draco::PlyPropertyReader<unsigned_char>_> *)&va,
                       (PlyPropertyReader<unsigned_char> *)va.buffer_);
          }
        }
        GeometryAttribute::GeometryAttribute(&va);
        GeometryAttribute::Init
                  (&va,COLOR,(DataBuffer *)0x0,(uint8_t)uVar19,DT_UINT8,true,(ulong)uVar19,0);
        VVar16 = (ValueType)local_f0;
        iVar8 = PointCloud::AddAttribute(this->out_point_cloud_,&va,true,VVar16);
        if (VVar16 != 0) {
          uVar15 = (ulong)local_ac;
          uVar14 = 0;
          do {
            lVar20 = 0;
            do {
              pPVar12 = properties.
                        super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20];
              y_reader.property_._0_4_ = (undefined4)uVar14;
              if (*(long *)((long)&(pPVar12->name_).field_2 + 8) == 0) {
                std::__throw_bad_function_call();
                goto LAB_00119d00;
              }
              uVar6 = (*(code *)(pPVar12->data_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)
                                (&(pPVar12->name_)._M_string_length,&y_reader);
              *(undefined1 *)((long)&z_reader.property_ + lVar20) = uVar6;
              lVar20 = lVar20 + 1;
            } while (((uVar15 - (property == (PlyProperty *)0x0)) + 2) -
                     (ulong)(local_108 == (PlyProperty *)0x0) != lVar20);
            _Var4._M_t.
            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
                 (this->out_point_cloud_->attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
            sVar5 = *(size_t *)
                     ((long)_Var4._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     0x28);
            memcpy((void *)(sVar5 * uVar14 +
                           **(long **)_Var4._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl),&z_reader,sVar5);
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_a8);
        }
        std::
        vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
        ::~vector((vector<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<unsigned_char>,_std::default_delete<draco::PlyPropertyReader<unsigned_char>_>_>_>_>
                   *)&properties);
      }
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&va,"x, y, and z properties must have the same type","");
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
               (long)&((va.buffer_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + va.buffer_descriptor_.buffer_id);
  }
  if (va.buffer_ == (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
    return __return_storage_ptr__;
  }
LAB_0011934d:
  operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeVertexData(const PlyElement *vertex_element) {
  if (vertex_element == nullptr) {
    return Status(Status::INVALID_PARAMETER, "vertex_element is null");
  }
  // TODO(b/34330853): For now, try to load x,y,z vertices, red,green,blue,alpha
  // colors, and nx,ny,nz normals. We need to add other properties later.
  const PlyProperty *const x_prop = vertex_element->GetPropertyByName("x");
  const PlyProperty *const y_prop = vertex_element->GetPropertyByName("y");
  const PlyProperty *const z_prop = vertex_element->GetPropertyByName("z");
  if (!x_prop || !y_prop || !z_prop) {
    // Currently, we require 3 vertex coordinates (this should be generalized
    // later on).
    return Status(Status::INVALID_PARAMETER, "x, y, or z property is missing");
  }
  const PointIndex::ValueType num_vertices = vertex_element->num_entries();
  out_point_cloud_->set_num_points(num_vertices);
  // Decode vertex positions.
  {
    // All properties must have the same type.
    if (x_prop->data_type() != y_prop->data_type() ||
        y_prop->data_type() != z_prop->data_type()) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must have the same type");
    }
    // TODO(ostava): For now assume the position types are float32 or int32.
    const DataType dt = x_prop->data_type();
    if (dt != DT_FLOAT32 && dt != DT_INT32) {
      return Status(Status::INVALID_PARAMETER,
                    "x, y, and z properties must be of type float32 or int32");
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, dt, false,
            DataTypeLength(dt) * 3, 0);
    const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
    std::vector<const PlyProperty *> properties;
    properties.push_back(x_prop);
    properties.push_back(y_prop);
    properties.push_back(z_prop);
    if (dt == DT_FLOAT32) {
      ReadPropertiesToAttribute<float>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    } else if (dt == DT_INT32) {
      ReadPropertiesToAttribute<int32_t>(
          properties, out_point_cloud_->attribute(att_id), num_vertices);
    }
  }

  // Decode normals if present.
  const PlyProperty *const n_x_prop = vertex_element->GetPropertyByName("nx");
  const PlyProperty *const n_y_prop = vertex_element->GetPropertyByName("ny");
  const PlyProperty *const n_z_prop = vertex_element->GetPropertyByName("nz");
  if (n_x_prop != nullptr && n_y_prop != nullptr && n_z_prop != nullptr) {
    // For now, all normal properties must be set and of type float32
    if (n_x_prop->data_type() == DT_FLOAT32 &&
        n_y_prop->data_type() == DT_FLOAT32 &&
        n_z_prop->data_type() == DT_FLOAT32) {
      PlyPropertyReader<float> x_reader(n_x_prop);
      PlyPropertyReader<float> y_reader(n_y_prop);
      PlyPropertyReader<float> z_reader(n_z_prop);
      GeometryAttribute va;
      va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
              sizeof(float) * 3, 0);
      const int att_id = out_point_cloud_->AddAttribute(va, true, num_vertices);
      for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
        std::array<float, 3> val;
        val[0] = x_reader.ReadValue(i);
        val[1] = y_reader.ReadValue(i);
        val[2] = z_reader.ReadValue(i);
        out_point_cloud_->attribute(att_id)->SetAttributeValue(
            AttributeValueIndex(i), &val[0]);
      }
    }
  }

  // Decode color data if present.
  int num_colors = 0;
  const PlyProperty *const r_prop = vertex_element->GetPropertyByName("red");
  const PlyProperty *const g_prop = vertex_element->GetPropertyByName("green");
  const PlyProperty *const b_prop = vertex_element->GetPropertyByName("blue");
  const PlyProperty *const a_prop = vertex_element->GetPropertyByName("alpha");
  if (r_prop) {
    ++num_colors;
  }
  if (g_prop) {
    ++num_colors;
  }
  if (b_prop) {
    ++num_colors;
  }
  if (a_prop) {
    ++num_colors;
  }

  if (num_colors) {
    std::vector<std::unique_ptr<PlyPropertyReader<uint8_t>>> color_readers;
    const PlyProperty *p;
    if (r_prop) {
      p = r_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'red' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (g_prop) {
      p = g_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'green' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (b_prop) {
      p = b_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'blue' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }
    if (a_prop) {
      p = a_prop;
      // TODO(ostava): For now ensure the data type of all components is uint8.
      DRACO_DCHECK_EQ(true, p->data_type() == DT_UINT8);
      if (p->data_type() != DT_UINT8) {
        return Status(Status::INVALID_PARAMETER,
                      "Type of 'alpha' property must be uint8");
      }
      color_readers.push_back(std::unique_ptr<PlyPropertyReader<uint8_t>>(
          new PlyPropertyReader<uint8_t>(p)));
    }

    GeometryAttribute va;
    va.Init(GeometryAttribute::COLOR, nullptr, num_colors, DT_UINT8, true,
            sizeof(uint8_t) * num_colors, 0);
    const int32_t att_id =
        out_point_cloud_->AddAttribute(va, true, num_vertices);
    for (PointIndex::ValueType i = 0; i < num_vertices; ++i) {
      std::array<uint8_t, 4> val;
      for (int j = 0; j < num_colors; j++) {
        val[j] = color_readers[j]->ReadValue(i);
      }
      out_point_cloud_->attribute(att_id)->SetAttributeValue(
          AttributeValueIndex(i), &val[0]);
    }
  }

  return OkStatus();
}